

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_misc_tests.cpp
# Opt level: O0

void __thiscall
iu_UnitAnyTest_x_iutest_x_Empty_Test::Body(iu_UnitAnyTest_x_iutest_x_Empty_Test *this)

{
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  AssertionHelper local_3f0;
  Fixed local_3c0;
  undefined1 local_238 [8];
  AssertionResult iutest_ar_1;
  Fixed local_1e0;
  undefined1 local_58 [8];
  AssertionResult iutest_ar;
  any *p;
  any a;
  iu_UnitAnyTest_x_iutest_x_Empty_Test *this_local;
  
  a.content = (placeholder *)this;
  iutest::any::any((any *)&p);
  iutest::detail::AlwaysZero();
  piVar2 = iutest::unsafe_any_cast<int>((any *)0x0);
  iutest::internal::NullHelper<false>::CompareEq<int>
            ((AssertionResult *)local_58,"(::iutest::unsafe_any_cast<int>(p))",piVar2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_58);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_misc_tests.cpp"
               ,0x2d,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_1e0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  iutest::detail::AlwaysZero();
  piVar2 = iutest::unsafe_any_cast<int>((any *)&p);
  iutest::internal::NullHelper<false>::CompareEq<int>
            ((AssertionResult *)local_238,"(::iutest::unsafe_any_cast<int>(&a))",piVar2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    memset(&local_3c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3c0);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_238);
    iutest::AssertionHelper::AssertionHelper
              (&local_3f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_misc_tests.cpp"
               ,0x2e,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_3f0,&local_3c0);
    iutest::AssertionHelper::~AssertionHelper(&local_3f0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  iutest::any::~any((any *)&p);
  return;
}

Assistant:

IUTEST(UnitAnyTest, Empty)
{
    ::iutest::any a;
    ::iutest::any* p = NULL;
    IUTEST_EXPECT_NULL(::iutest::unsafe_any_cast<int>(p));
    IUTEST_EXPECT_NULL(::iutest::unsafe_any_cast<int>(&a));
}